

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::TestPlusArgsFunction::~TestPlusArgsFunction(TestPlusArgsFunction *this)

{
  SimpleSystemSubroutine::~SimpleSystemSubroutine((SimpleSystemSubroutine *)this);
  operator_delete(this,0x68);
  return;
}

Assistant:

TestPlusArgsFunction(const Builtins& builtins) :
        NonConstantFunction(KnownSystemName::TestPlusArgs, builtins.intType, 1,
                            std::vector<const Type*>{&builtins.stringType}) {}